

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O2

bool __thiscall
QFutureInterfaceBasePrivate::internal_updateProgress
          (QFutureInterfaceBasePrivate *this,int progress,QString *progressText)

{
  QElapsedTimer *this_00;
  bool bVar1;
  qint64 qVar2;
  
  if (progress <= this->m_progressValue) {
    return false;
  }
  this->m_progressValue = progress;
  QString::operator=(&((this->m_progress).d)->text,progressText);
  this_00 = &this->progressTime;
  bVar1 = QElapsedTimer::isValid(this_00);
  if (((bVar1) && (this->m_progressValue != ((this->m_progress).d)->maximum)) &&
     (qVar2 = QElapsedTimer::elapsed(this_00), qVar2 < 0x28)) {
    return false;
  }
  QElapsedTimer::start(this_00);
  return true;
}

Assistant:

bool QFutureInterfaceBasePrivate::internal_updateProgress(int progress,
                                                          const QString &progressText)
{
    if (m_progressValue >= progress)
        return false;

    Q_ASSERT(m_progress);

    m_progressValue = progress;
    m_progress->text = progressText;

    if (progressTime.isValid() && m_progressValue != m_progress->maximum) // make sure the first and last steps are emitted.
        if (progressTime.elapsed() < (1000 / MaxProgressEmitsPerSecond))
            return false;

    progressTime.start();
    return true;
}